

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O1

uint64_t pack_mode7_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint32_t a,uint8_t *pSelectors,
                   uint32_t num_pixels,color_quad_u8 *pPixels)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  uint5 uVar9;
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  uint uVar12;
  uint64_t uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  uVar14 = 0;
  uVar15 = 0xffffffff;
  uVar12 = 0;
  do {
    uVar18 = uVar12 >> 1;
    uVar17 = (ulong)((uVar12 & 1) << 2);
    uVar18 = (uint)*(ushort *)((long)&g_bc7_mode_7_optimal_endpoints[a][uVar18][0].m_error + uVar17)
             + (uint)*(ushort *)
                      ((long)&g_bc7_mode_7_optimal_endpoints[b][uVar18][0].m_error + uVar17) +
             (uint)*(ushort *)((long)&g_bc7_mode_7_optimal_endpoints[g][uVar18][0].m_error + uVar17)
             + (uint)*(ushort *)
                      ((long)&g_bc7_mode_7_optimal_endpoints[r][uVar18][0].m_error + uVar17);
    if (uVar18 < uVar15) {
      uVar14 = uVar12;
    }
    if (uVar18 < uVar15 && uVar18 == 0) break;
    if (uVar18 < uVar15) {
      uVar15 = uVar18;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 4);
  uVar12 = uVar14 >> 1;
  uVar15 = (uVar14 & 1) * 4;
  uVar1 = (&g_bc7_mode_7_optimal_endpoints[g][uVar12][0].m_lo)[uVar15];
  uVar2 = (&g_bc7_mode_7_optimal_endpoints[b][uVar12][0].m_lo)[uVar15];
  uVar3 = (&g_bc7_mode_7_optimal_endpoints[a][uVar12][0].m_lo)[uVar15];
  (pResults->m_low_endpoint).m_c[0] = (&g_bc7_mode_7_optimal_endpoints[r][uVar12][0].m_lo)[uVar15];
  (pResults->m_low_endpoint).m_c[1] = uVar1;
  (pResults->m_low_endpoint).m_c[2] = uVar2;
  (pResults->m_low_endpoint).m_c[3] = uVar3;
  uVar1 = (&g_bc7_mode_7_optimal_endpoints[g][uVar12][0].m_hi)[uVar15];
  uVar2 = (&g_bc7_mode_7_optimal_endpoints[b][uVar12][0].m_hi)[uVar15];
  uVar3 = (&g_bc7_mode_7_optimal_endpoints[a][uVar12][0].m_hi)[uVar15];
  (pResults->m_high_endpoint).m_c[0] = (&g_bc7_mode_7_optimal_endpoints[r][uVar12][0].m_hi)[uVar15];
  (pResults->m_high_endpoint).m_c[1] = uVar1;
  (pResults->m_high_endpoint).m_c[2] = uVar2;
  (pResults->m_high_endpoint).m_c[3] = uVar3;
  pResults->m_pbits[0] = uVar14 & 1;
  pResults->m_pbits[1] = uVar12;
  if (num_pixels == 0) {
    uVar13 = 0;
  }
  else {
    memset(pSelectors,1,(ulong)num_pixels);
    uVar15 = *(uint *)(pResults->m_low_endpoint).m_c;
    auVar5[0xc] = (char)(uVar15 >> 0x18);
    auVar5._0_12_ = ZEXT712(0);
    uVar9 = CONCAT32(auVar5._10_3_,(ushort)(byte)(uVar15 >> 0x10));
    auVar11._5_8_ = 0;
    auVar11._0_5_ = uVar9;
    uVar14 = pResults->m_pbits[0];
    uVar12 = uVar14 | (uVar15 & 0xff) * 2;
    uVar15 = uVar14 | (int)CONCAT72(SUB137(auVar11 << 0x40,6),(ushort)(byte)(uVar15 >> 8)) * 2;
    uVar18 = uVar14 | (int)uVar9 * 2;
    uVar14 = uVar14 | (uint)(uint3)(auVar5._10_3_ >> 0x10) * 2;
    auVar23._0_4_ = uVar12 << 2;
    auVar23._4_4_ = uVar15 << 2;
    auVar23._8_4_ = uVar18 << 2;
    auVar23._12_4_ = uVar14 << 2;
    auVar25._0_4_ = uVar12 >> 6;
    auVar25._4_4_ = uVar15 >> 6;
    auVar25._8_4_ = uVar18 >> 6;
    auVar25._12_4_ = uVar14 >> 6;
    auVar25 = auVar25 | auVar23;
    uVar4 = *(undefined4 *)(pResults->m_high_endpoint).m_c;
    uVar17 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
    auVar6._8_4_ = 0;
    auVar6._0_8_ = uVar17;
    auVar6[0xc] = (char)((uint)uVar4 >> 0x18);
    auVar7[8] = (char)((uint)uVar4 >> 0x10);
    auVar7._0_8_ = uVar17;
    auVar7[9] = 0;
    auVar7._10_3_ = auVar6._10_3_;
    auVar10._5_8_ = 0;
    auVar10._0_5_ = auVar7._8_5_;
    auVar8[4] = (char)((uint)uVar4 >> 8);
    auVar8._0_4_ = (int)uVar17;
    auVar8[5] = 0;
    auVar8._6_7_ = SUB137(auVar10 << 0x40,6);
    uVar15 = pResults->m_pbits[1];
    uVar14 = uVar15 | (int)uVar17 * 2;
    uVar12 = uVar15 | auVar8._4_4_ * 2;
    uVar18 = uVar15 | auVar7._8_4_ * 2;
    uVar15 = uVar15 | (uint)(uint3)(auVar6._10_3_ >> 0x10) * 2;
    auVar26._0_4_ = uVar14 << 2;
    auVar26._4_4_ = uVar12 << 2;
    auVar26._8_4_ = uVar18 << 2;
    auVar26._12_4_ = uVar15 << 2;
    auVar24._0_4_ = uVar14 >> 6;
    auVar24._4_4_ = uVar12 >> 6;
    auVar24._8_4_ = uVar18 >> 6;
    auVar24._12_4_ = uVar15 >> 6;
    auVar24 = auVar24 | auVar26;
    iVar16 = auVar24._4_4_;
    auVar27._4_4_ = iVar16;
    auVar27._0_4_ = iVar16;
    auVar27._8_4_ = auVar24._12_4_;
    auVar27._12_4_ = auVar24._12_4_;
    uVar14 = auVar24._0_4_ * 0x15 + auVar25._0_4_ * 0x2b + 0x20U >> 6 & 0xff;
    uVar15 = iVar16 * 0x15 + auVar25._4_4_ * 0x2b + 0x20U >> 6 & 0xff;
    uVar12 = (int)((auVar24._8_8_ & 0xffffffff) * 0x15) + (int)((auVar25._8_8_ & 0xffffffff) * 0x2b)
             + 0x20U >> 6 & 0xff;
    iVar16 = uVar12 * 0x25 + uVar14 * 0x6d + uVar15 * 0x16e;
    uVar17 = 0;
    uVar13 = 0;
    do {
      uVar18 = (uint)pPixels[uVar17].m_c[0];
      if (pParams->m_perceptual == '\0') {
        iVar20 = uVar14 - uVar18;
        iVar19 = uVar15 - pPixels[uVar17].m_c[1];
        iVar21 = uVar12 - pPixels[uVar17].m_c[2];
      }
      else {
        iVar21 = (uint)pPixels[uVar17].m_c[2] * 0x25 +
                 (uint)pPixels[uVar17].m_c[1] * 0x16e + uVar18 * 0x6d;
        iVar20 = iVar16 - iVar21 >> 8;
        iVar19 = (int)(((uVar14 - uVar18) * 0x200 - iVar16) + iVar21) >> 8;
        iVar21 = (int)((uVar12 * 0x200 - ((uint)pPixels[uVar17].m_c[2] * 0x200 + iVar16)) + iVar21)
                 >> 8;
      }
      iVar22 = ((int)((auVar27._8_8_ & 0xffffffff) * 0x15) + auVar25._12_4_ * 0x2b + 0x20U >> 6 &
               0xff) - (uint)pPixels[uVar17].m_c[3];
      uVar13 = uVar13 + iVar22 * iVar22 * pParams->m_weights[3] +
               (ulong)(iVar21 * iVar21 * pParams->m_weights[2] +
                      iVar19 * iVar19 * pParams->m_weights[1] +
                      iVar20 * iVar20 * pParams->m_weights[0]);
      uVar17 = uVar17 + 1;
    } while (num_pixels != uVar17);
  }
  pResults->m_best_overall_err = uVar13;
  return uVar13;
}

Assistant:

static uint64_t pack_mode7_to_one_color(const color_cell_compressor_params* pParams, color_cell_compressor_results* pResults, uint32_t r, uint32_t g, uint32_t b, uint32_t a,
	uint8_t* pSelectors, uint32_t num_pixels, const color_quad_u8* pPixels)
{
	uint32_t best_err = UINT_MAX;
	uint32_t best_p = 0;

	for (uint32_t p = 0; p < 4; p++)
	{
		uint32_t hi_p = p >> 1;
		uint32_t lo_p = p & 1;
		uint32_t err = g_bc7_mode_7_optimal_endpoints[r][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[g][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[b][hi_p][lo_p].m_error + g_bc7_mode_7_optimal_endpoints[a][hi_p][lo_p].m_error;
		if (err < best_err)
		{
			best_err = err;
			best_p = p;
			if (!best_err)
				break;
		}
	}

	uint32_t best_hi_p = best_p >> 1;
	uint32_t best_lo_p = best_p & 1;

	const endpoint_err* pEr = &g_bc7_mode_7_optimal_endpoints[r][best_hi_p][best_lo_p];
	const endpoint_err* pEg = &g_bc7_mode_7_optimal_endpoints[g][best_hi_p][best_lo_p];
	const endpoint_err* pEb = &g_bc7_mode_7_optimal_endpoints[b][best_hi_p][best_lo_p];
	const endpoint_err* pEa = &g_bc7_mode_7_optimal_endpoints[a][best_hi_p][best_lo_p];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, pEa->m_lo);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, pEa->m_hi);
	pResults->m_pbits[0] = best_lo_p;
	pResults->m_pbits[1] = best_hi_p;

	for (uint32_t i = 0; i < num_pixels; i++)
		pSelectors[i] = BC7E_MODE_7_OPTIMAL_INDEX;

	color_quad_u8 p;

	for (uint32_t i = 0; i < 4; i++)
	{
		uint32_t low = (pResults->m_low_endpoint.m_c[i] << 1) | pResults->m_pbits[0];
		uint32_t high = (pResults->m_high_endpoint.m_c[i] << 1) | pResults->m_pbits[1];

		low = (low << 2) | (low >> 6);
		high = (high << 2) | (high >> 6);

		p.m_c[i] = (low * (64 - g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX]) + high * g_bc7_weights2[BC7E_MODE_7_OPTIMAL_INDEX] + 32) >> 6;
	}

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < num_pixels; i++)
		total_err += compute_color_distance_rgba(&p, &pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}